

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolsb.c
# Opt level: O0

int ffppnsb(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,char *array,char nulval,
           int *status)

{
  int iVar1;
  LONGLONG local_58;
  char local_49;
  LONGLONG LStack_48;
  char nullvalue;
  long row;
  char *pcStack_38;
  char nulval_local;
  char *array_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  row._7_1_ = nulval;
  pcStack_38 = array;
  array_local = (char *)nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_58 = 1;
    }
    else {
      local_58 = firstelem_local;
    }
    LStack_48 = local_58;
    ffpcnsb((fitsfile *)group_local,2,local_58,nelem_local,(LONGLONG)array_local,pcStack_38,
            row._7_1_,status);
    fptr_local._4_4_ = *status;
  }
  else {
    local_49 = row._7_1_;
    fits_write_compressed_pixels
              ((fitsfile *)group_local,0xc,nelem_local,(LONGLONG)array_local,1,pcStack_38,&local_49,
               status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffppnsb( fitsfile *fptr,  /* I - FITS file pointer                      */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            signed char *array, /* I - array of values that are written     */
            signed char nulval, /* I - undefined pixel value                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).  Any array values
  that are equal to the value of nulval will be replaced with the null
  pixel value that is appropriate for this column.
*/
{
    long row;
    signed char nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        nullvalue = nulval;  /* set local variable */
        fits_write_compressed_pixels(fptr, TSBYTE, firstelem, nelem,
            1, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpcnsb(fptr, 2, row, firstelem, nelem, array, nulval, status);
    return(*status);
}